

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DoWhileStatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DoWhileStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  StatementSyntax *node;
  SyntaxNode *node_00;
  SyntaxNode *local_90;
  size_t index_local;
  DoWhileStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    TokenOrSyntax::TokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_90 = (SyntaxNode *)0x0;
    if (this != (DoWhileStatementSyntax *)0xffffffffffffffe8) {
      local_90 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 2:
    token.kind = (this->doKeyword).kind;
    token._2_1_ = (this->doKeyword).field_0x2;
    token.numFlags.raw = (this->doKeyword).numFlags.raw;
    token.rawLen = (this->doKeyword).rawLen;
    token.info = (this->doKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    node = not_null<slang::syntax::StatementSyntax_*>::get(&this->statement);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  case 4:
    token_00.kind = (this->whileKeyword).kind;
    token_00._2_1_ = (this->whileKeyword).field_0x2;
    token_00.numFlags.raw = (this->whileKeyword).numFlags.raw;
    token_00.rawLen = (this->whileKeyword).rawLen;
    token_00.info = (this->whileKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 5:
    token_01.kind = (this->openParen).kind;
    token_01._2_1_ = (this->openParen).field_0x2;
    token_01.numFlags.raw = (this->openParen).numFlags.raw;
    token_01.rawLen = (this->openParen).rawLen;
    token_01.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 6:
    node_00 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node_00);
    break;
  case 7:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 8:
    token_03.kind = (this->semi).kind;
    token_03._2_1_ = (this->semi).field_0x2;
    token_03.numFlags.raw = (this->semi).numFlags.raw;
    token_03.rawLen = (this->semi).rawLen;
    token_03.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DoWhileStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return doKeyword;
        case 3: return statement.get();
        case 4: return whileKeyword;
        case 5: return openParen;
        case 6: return expr.get();
        case 7: return closeParen;
        case 8: return semi;
        default: return nullptr;
    }
}